

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O3

CURLcode glob_next_url(char **globbed,URLGlob *glob)

{
  size_t sVar1;
  CURLcode CVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  curl_off_t *pcVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  
  sVar1 = glob->urllen;
  pcVar3 = glob->glob_buffer;
  *globbed = (char *)0x0;
  if (glob->beenhere == '\0') {
    glob->beenhere = '\x01';
    bVar11 = glob->size == 0;
LAB_0011d3ce:
    if (!bVar11) {
      lVar9 = sVar1 + 1;
      pcVar6 = &glob->pattern[0].content.NumRange.ptr_n;
      uVar10 = 0;
      do {
        iVar8 = *(int *)(pcVar6 + -4);
        if (iVar8 == 3) {
          curl_msnprintf(pcVar3,lVar9,"%0*ld",*(int *)(pcVar6 + -1),*pcVar6);
LAB_0011d47a:
          sVar4 = strlen(pcVar3);
          pcVar3 = pcVar3 + sVar4;
          lVar9 = lVar9 - sVar4;
        }
        else if (iVar8 == 2) {
          if (lVar9 == 0) {
            lVar9 = 0;
          }
          else {
            *pcVar3 = *(char *)((long)pcVar6 + -0x16);
            pcVar3[1] = '\0';
            pcVar3 = pcVar3 + 1;
            lVar9 = lVar9 + -1;
          }
        }
        else {
          if (iVar8 != 1) {
LAB_0011d4a6:
            curl_mprintf("internal error: invalid pattern type (%d)\n");
            return CURLE_FAILED_INIT;
          }
          if (((anon_struct_40_5_0c6859e6_for_NumRange *)(pcVar6 + -3))->min_n != 0) {
            curl_msnprintf(pcVar3,lVar9,"%s");
            goto LAB_0011d47a;
          }
        }
        uVar10 = uVar10 + 1;
        pcVar6 = pcVar6 + 6;
      } while (uVar10 < glob->size);
    }
    pcVar3 = strdup(glob->glob_buffer);
    *globbed = pcVar3;
    CVar2 = CURLE_OUT_OF_MEMORY;
    if (pcVar3 != (char *)0x0) {
      CVar2 = CURLE_OK;
    }
  }
  else {
    sVar5 = glob->size;
    CVar2 = CURLE_OK;
    if (sVar5 != 0) {
      pcVar6 = &glob->pattern[sVar5 - 1].content.NumRange.step;
      do {
        iVar8 = (int)pcVar6[-5];
        if (iVar8 == 3) {
          lVar9 = pcVar6[-1];
          pcVar6[-1] = lVar9 + *pcVar6;
          if (lVar9 + *pcVar6 <= pcVar6[-3]) {
LAB_0011d3cc:
            bVar11 = false;
            goto LAB_0011d3ce;
          }
          pcVar6[-1] = ((anon_struct_40_5_0c6859e6_for_NumRange *)(pcVar6 + -4))->min_n;
        }
        else if (iVar8 == 2) {
          cVar7 = *(char *)((long)pcVar6 + -0x1e) + *(char *)((long)pcVar6 + -0x1c);
          *(char *)((long)pcVar6 + -0x1e) = cVar7;
          if (cVar7 <= *(char *)((long)pcVar6 + -0x1f)) goto LAB_0011d3cc;
          *(char *)((long)pcVar6 + -0x1e) =
               (char)((anon_struct_40_5_0c6859e6_for_NumRange *)(pcVar6 + -4))->min_n;
        }
        else {
          if (iVar8 != 1) goto LAB_0011d4a6;
          bVar11 = false;
          if (((anon_struct_40_5_0c6859e6_for_NumRange *)(pcVar6 + -4))->min_n == 0)
          goto LAB_0011d3ce;
          lVar9 = (long)*(int *)(pcVar6 + -2) + 1;
          iVar8 = (int)lVar9;
          if (pcVar6[-3] == lVar9) {
            iVar8 = 0;
          }
          *(int *)(pcVar6 + -2) = iVar8;
          if (pcVar6[-3] != lVar9) goto LAB_0011d3ce;
        }
        pcVar6 = pcVar6 + -6;
        sVar5 = sVar5 - 1;
        CVar2 = CURLE_OK;
      } while (sVar5 != 0);
    }
  }
  return CVar2;
}

Assistant:

CURLcode glob_next_url(char **globbed, struct URLGlob *glob)
{
  struct URLPattern *pat;
  size_t i;
  size_t len;
  size_t buflen = glob->urllen + 1;
  char *buf = glob->glob_buffer;

  *globbed = NULL;

  if(!glob->beenhere)
    glob->beenhere = 1;
  else {
    bool carry = TRUE;

    /* implement a counter over the index ranges of all patterns, starting
       with the rightmost pattern */
    for(i = 0; carry && (i < glob->size); i++) {
      carry = FALSE;
      pat = &glob->pattern[glob->size - 1 - i];
      switch(pat->type) {
      case UPTSet:
        if((pat->content.Set.elements) &&
           (++pat->content.Set.ptr_s == pat->content.Set.size)) {
          pat->content.Set.ptr_s = 0;
          carry = TRUE;
        }
        break;
      case UPTCharRange:
        pat->content.CharRange.ptr_c =
          (char)(pat->content.CharRange.step +
                 (int)((unsigned char)pat->content.CharRange.ptr_c));
        if(pat->content.CharRange.ptr_c > pat->content.CharRange.max_c) {
          pat->content.CharRange.ptr_c = pat->content.CharRange.min_c;
          carry = TRUE;
        }
        break;
      case UPTNumRange:
        pat->content.NumRange.ptr_n += pat->content.NumRange.step;
        if(pat->content.NumRange.ptr_n > pat->content.NumRange.max_n) {
          pat->content.NumRange.ptr_n = pat->content.NumRange.min_n;
          carry = TRUE;
        }
        break;
      default:
        printf("internal error: invalid pattern type (%d)\n", (int)pat->type);
        return CURLE_FAILED_INIT;
      }
    }
    if(carry) {         /* first pattern ptr has run into overflow, done! */
      return CURLE_OK;
    }
  }

  for(i = 0; i < glob->size; ++i) {
    pat = &glob->pattern[i];
    switch(pat->type) {
    case UPTSet:
      if(pat->content.Set.elements) {
        msnprintf(buf, buflen, "%s",
                  pat->content.Set.elements[pat->content.Set.ptr_s]);
        len = strlen(buf);
        buf += len;
        buflen -= len;
      }
      break;
    case UPTCharRange:
      if(buflen) {
        *buf++ = pat->content.CharRange.ptr_c;
        *buf = '\0';
        buflen--;
      }
      break;
    case UPTNumRange:
      msnprintf(buf, buflen, "%0*" CURL_FORMAT_CURL_OFF_T,
                pat->content.NumRange.padlength,
                pat->content.NumRange.ptr_n);
      len = strlen(buf);
      buf += len;
      buflen -= len;
      break;
    default:
      printf("internal error: invalid pattern type (%d)\n", (int)pat->type);
      return CURLE_FAILED_INIT;
    }
  }

  *globbed = strdup(glob->glob_buffer);
  if(!*globbed)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}